

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O0

URL * __thiscall URL::GetFullURL_abi_cxx11_(URL *this)

{
  string *in_RSI;
  URL *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

std::string URL::GetFullURL() {
  return _url;
}